

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::
ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::ConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
           *this,int info)

{
  StringRef name_00;
  uint in_ESI;
  undefined8 *in_RDI;
  StringRef SVar1;
  IntSuffixHandler suffix_handler_1;
  DblSuffixHandler suffix_handler;
  Kind kind;
  StringRef name;
  int num_values;
  int num_items;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
  *in_stack_ffffffffffffff58;
  ConHandler *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff78;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
  *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
  *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  SuffixHandler<int> *pSStack_28;
  ConHandler local_18;
  int local_10;
  uint local_c;
  
  local_c = in_ESI;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>::ConHandler::
  ConHandler(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_10 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>::
             ConHandler::num_items(&local_18);
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>::ReadUInt
            (in_stack_ffffffffffffff80,(uint)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (uint)in_stack_ffffffffffffff78);
  SVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadName
                    ((BinaryReader<mp::internal::IdentityConverter> *)0x221973);
  BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
  pSStack_28 = (SuffixHandler<int> *)SVar1.size_;
  if ((local_c & 4) == 0) {
    name_00.size_ = in_stack_ffffffffffffff98;
    name_00.data_ = (char *)in_stack_ffffffffffffff90;
    TestNLHandler::OnIntSuffix
              ((TestNLHandler *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               name_00,SVar1.size_._4_4_,(int)SVar1.size_);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::IntReader,TestNLHandler::SuffixHandler<int>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
               pSStack_28);
    TestNLHandler::SuffixHandler<int>::~SuffixHandler((SuffixHandler<int> *)0x221a97);
  }
  else {
    SVar1.size_ = in_stack_ffffffffffffff98;
    SVar1.data_ = (char *)in_stack_ffffffffffffff90;
    TestNLHandler::OnDblSuffix
              ((TestNLHandler *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),SVar1,
               (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::DoubleReader,TestNLHandler::SuffixHandler<double>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
               (SuffixHandler<double> *)in_stack_ffffffffffffff80);
    TestNLHandler::SuffixHandler<double>::~SuffixHandler((SuffixHandler<double> *)0x221a13);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}